

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O3

DisasJumpType op_vlbb(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  int iVar2;
  TCGContext_conflict12 *s_00;
  DisasJumpType DVar3;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGv_i64 local_48;
  TCGTemp *local_40;
  
  uVar1 = (s->fields).presentO;
  if (((uVar1 & 0x10) != 0) && ((uVar1 >> 0x16 & 1) != 0)) {
    uVar1 = (s->fields).c[0];
    if ((uVar1 & 0xe0) == 0) {
      iVar2 = (s->fields).c[2];
      if (iVar2 < 7) {
        s_00 = s->uc->tcg_ctx;
        ts = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
        ts_00 = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
        tcg_gen_ori_i64_s390x
                  (s_00,(TCGv_i64)((long)ts - (long)s_00),o->addr1,-1L << ((char)iVar2 + 6U & 0x3f))
        ;
        tcg_gen_op2_s390x(s_00,INDEX_op_neg_i64,(TCGArg)ts,(TCGArg)ts);
        tcg_gen_addi_i64_s390x
                  (s_00,(TCGv_i64)((long)ts_00 - (long)s_00),(TCGv_i64)s_00->cpu_env,
                   (ulong)((uVar1 & 0x1f) << 4) + 0x80);
        local_58 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
        local_48 = o->addr1 + (long)s_00;
        local_50 = ts_00;
        local_40 = ts;
        tcg_gen_callN_s390x(s_00,helper_vll,(TCGTemp *)0x0,4,&local_58);
        tcg_temp_free_internal_s390x(s_00,ts);
        tcg_temp_free_internal_s390x(s_00,ts_00);
        DVar3 = DISAS_NEXT;
      }
      else {
        gen_program_exception(s,6);
        DVar3 = DISAS_NORETURN;
      }
      return DVar3;
    }
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
               ,0xdf,"reg < 32");
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_vlbb(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const int64_t block_size = (1ull << (get_field(s, m3) + 6));
    const int v1_offs = vec_full_reg_offset(get_field(s, v1));
    TCGv_ptr a0;
    TCGv_i64 bytes;

    if (get_field(s, m3) > 6) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    bytes = tcg_temp_new_i64(tcg_ctx);
    a0 = tcg_temp_new_ptr(tcg_ctx);
    /* calculate the number of bytes until the next block boundary */
    tcg_gen_ori_i64(tcg_ctx, bytes, o->addr1, -block_size);
    tcg_gen_neg_i64(tcg_ctx, bytes, bytes);

    tcg_gen_addi_ptr(tcg_ctx, a0, tcg_ctx->cpu_env, v1_offs);
    gen_helper_vll(tcg_ctx, tcg_ctx->cpu_env, a0, o->addr1, bytes);
    tcg_temp_free_i64(tcg_ctx, bytes);
    tcg_temp_free_ptr(tcg_ctx, a0);
    return DISAS_NEXT;
}